

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

void Aig_ManDfsAll_rec(Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  void **ppvVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  int iVar5;
  
  if (pObj->TravId == p->nTravIds) {
    return;
  }
  pObj->TravId = p->nTravIds;
  uVar1 = (uint)*(undefined8 *)&pObj->field_0x18;
  uVar3 = uVar1 & 7;
  if (uVar3 == 3) {
    pAVar4 = pObj->pFanin0;
LAB_006b4e47:
    Aig_ManDfsAll_rec(p,(Aig_Obj_t *)((ulong)pAVar4 & 0xfffffffffffffffe),vNodes);
  }
  else if (uVar3 != 2) {
    if ((uVar1 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigDfs.c"
                    ,0xc5,"void Aig_ManDfsAll_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *)");
    }
    Aig_ManDfsAll_rec(p,(Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
    pAVar4 = pObj->pFanin1;
    goto LAB_006b4e47;
  }
  uVar1 = vNodes->nCap;
  if (vNodes->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc(0x80);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar2;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_006b4ec1;
      if (vNodes->pArray == (void **)0x0) {
        ppvVar2 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar2 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
      }
      vNodes->pArray = ppvVar2;
    }
    vNodes->nCap = iVar5;
  }
LAB_006b4ec1:
  iVar5 = vNodes->nSize;
  vNodes->nSize = iVar5 + 1;
  vNodes->pArray[iVar5] = pObj;
  return;
}

Assistant:

void Aig_ManDfsAll_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    if ( Aig_ObjIsCo(pObj) )
    {
        Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
        Vec_PtrPush( vNodes, pObj );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin0(pObj), vNodes );
    Aig_ManDfsAll_rec( p, Aig_ObjFanin1(pObj), vNodes );
    Vec_PtrPush( vNodes, pObj );
}